

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

void virtio_legacy_set_promiscuous(virtio_device *dev,_Bool on)

{
  byte in_SIL;
  anon_struct_4_3_1c842367 cmd;
  size_t in_stack_00000060;
  void *in_stack_00000068;
  virtio_device *in_stack_00000070;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  byte local_9;
  
  local_9 = in_SIL & 1;
  memset(&local_d,0,4);
  local_d = 0;
  local_c = 0;
  local_b = (local_9 & 1) != 0;
  virtio_legacy_send_command(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  fprintf(_stdout,"[INFO ] %s:%d %s(): Set promisc to %u\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0xcb,"virtio_legacy_set_promiscuous",(ulong)(local_9 & 1));
  return;
}

Assistant:

static void virtio_legacy_set_promiscuous(struct virtio_device* dev, bool on) {
	struct {
		struct virtio_net_ctrl_hdr hdr;
		uint8_t on;
		uint8_t ack;
	} __attribute__((__packed__)) cmd = {};
	static_assert(sizeof(cmd) == 4, "Size of command struct wrong");

	cmd.hdr.class = VIRTIO_NET_CTRL_RX;
	cmd.hdr.cmd = VIRTIO_NET_CTRL_RX_PROMISC;
	cmd.on = on ? 1 : 0;

	virtio_legacy_send_command(dev, &cmd, sizeof(cmd));
	info("Set promisc to %u", on);
}